

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmq.hpp
# Opt level: O3

__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
 __thiscall
rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
::query(rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
        *this,__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              range_begin,
       __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
       range_end)

{
  unsigned_long *puVar1;
  ulong uVar2;
  pointer pvVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong *puVar9;
  ulong *puVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var14;
  ulong uVar15;
  ulong uVar16;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  unsigned_long uVar21;
  ulong uVar22;
  long lVar23;
  
  puVar1 = (this->_begin)._M_current;
  uVar19 = (long)range_begin._M_current - (long)puVar1 >> 3;
  uVar16 = (long)range_end._M_current - (long)puVar1 >> 3;
  if (uVar16 <= uVar19) {
    __assert_fail("begin_idx < end_idx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                  ,0xb5,
                  "Iterator rmq<__gnu_cxx::__normal_iterator<const unsigned long *, std::vector<unsigned long>>>::query(Iterator, Iterator) [Iterator = __gnu_cxx::__normal_iterator<const unsigned long *, std::vector<unsigned long>>, index_t = unsigned long]"
                 );
  }
  if (this->n < uVar16) {
    __assert_fail("end_idx <= n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                  ,0xb6,
                  "Iterator rmq<__gnu_cxx::__normal_iterator<const unsigned long *, std::vector<unsigned long>>>::query(Iterator, Iterator) [Iterator = __gnu_cxx::__normal_iterator<const unsigned long *, std::vector<unsigned long>>, index_t = unsigned long]"
                 );
  }
  uVar22 = uVar19 - 1;
  uVar2 = this->superblock_size;
  uVar18 = uVar22 / uVar2 + 1;
  if (puVar1 == range_begin._M_current) {
    uVar18 = 0;
  }
  uVar5 = uVar16 / uVar2;
  uVar6 = uVar5 - uVar18;
  _Var17._M_current = range_begin._M_current;
  if (uVar18 <= uVar5 && uVar6 != 0) {
    uVar12 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> uVar12 == 0; uVar12 = uVar12 - 1) {
      }
    }
    uVar12 = uVar12 & 0xffffffff;
    pvVar3 = (this->superblock_mins).
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = ((long)(this->superblock_mins).
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
            -0x5555555555555555;
    if (uVar12 <= uVar6 && uVar6 - uVar12 != 0) {
      lVar7 = *(long *)&pvVar3[uVar12].
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data;
      uVar6 = (long)*(pointer *)
                     ((long)&pvVar3[uVar12].
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data + 8) - lVar7 >> 3;
      if (uVar18 < uVar6) {
        uVar12 = uVar5 - (long)(1 << ((byte)uVar12 & 0x1f));
        if (uVar6 <= uVar12) {
          __assert_fail("dist < superblock_mins.size() && right_sb - (1<<dist) < superblock_mins[dist].size()"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                        ,0xcb,
                        "Iterator rmq<__gnu_cxx::__normal_iterator<const unsigned long *, std::vector<unsigned long>>>::query(Iterator, Iterator) [Iterator = __gnu_cxx::__normal_iterator<const unsigned long *, std::vector<unsigned long>>, index_t = unsigned long]"
                       );
        }
        _Var17._M_current = puVar1 + *(long *)(lVar7 + uVar18 * 8);
        if (puVar1[*(long *)(lVar7 + uVar12 * 8)] < puVar1[*(long *)(lVar7 + uVar18 * 8)]) {
          _Var17._M_current = puVar1 + *(long *)(lVar7 + uVar12 * 8);
        }
        goto LAB_00130f84;
      }
    }
    __assert_fail("dist < superblock_mins.size() && left_sb < superblock_mins[dist].size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                  ,0xc9,
                  "Iterator rmq<__gnu_cxx::__normal_iterator<const unsigned long *, std::vector<unsigned long>>>::query(Iterator, Iterator) [Iterator = __gnu_cxx::__normal_iterator<const unsigned long *, std::vector<unsigned long>>, index_t = unsigned long]"
                 );
  }
LAB_00130f84:
  uVar6 = uVar18 - 1;
  if ((uVar6 < uVar5) && (uVar19 != uVar18 * uVar2)) {
    uVar12 = this->n_blocks_per_superblock;
    lVar7 = uVar22 / this->block_size + 1;
    uVar15 = this->block_size * lVar7;
    uVar8 = lVar7 - uVar12 * uVar6;
    if (uVar12 != uVar8) {
      uVar13 = ~uVar8 + uVar12;
      if (uVar13 == 0) {
        uVar11 = 0x40;
      }
      else {
        lVar7 = 0x3f;
        if (uVar13 != 0) {
          for (; uVar13 >> lVar7 == 0; lVar7 = lVar7 + -1) {
          }
        }
        uVar11 = (uint)lVar7 ^ 0x3f;
      }
      if (puVar1[(ulong)*(ushort *)
                         (uVar8 * 2 +
                          *(long *)&(this->block_mins).
                                    super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[0x40 - uVar11].
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data +
                         (uVar12 - (long)((1 << (-(char)uVar11 & 0x1fU)) / 2)) * uVar6 * 2) +
                 uVar6 * uVar2] < *_Var17._M_current) {
        _Var17._M_current =
             puVar1 + (ulong)*(ushort *)
                              (uVar8 * 2 +
                               *(long *)&(this->block_mins).
                                         super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[0x40 - uVar11].
                                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                         ._M_impl.super__Vector_impl_data +
                              (uVar12 - (long)((1 << (-(char)uVar11 & 0x1fU)) / 2)) * uVar6 * 2) +
                      uVar6 * uVar2;
      }
    }
    if (uVar19 <= uVar15 && uVar15 - uVar19 != 0) {
      puVar9 = puVar1 + uVar15;
      puVar10 = range_begin._M_current + 1;
      _Var14._M_current = range_begin._M_current;
      if (puVar10 != puVar9 && puVar9 != range_begin._M_current) {
        uVar21 = *range_begin._M_current;
        do {
          if (*puVar10 < uVar21) {
            _Var14._M_current = puVar10;
            uVar21 = *puVar10;
          }
          puVar10 = puVar10 + 1;
        } while (puVar10 != puVar9);
      }
      if (*_Var14._M_current < *_Var17._M_current) {
        _Var17._M_current = _Var14._M_current;
      }
    }
  }
  if (((uVar18 <= uVar5) && (uVar5 != this->n_superblocks)) &&
     (uVar12 = uVar5 * uVar2, uVar16 != uVar12)) {
    lVar7 = this->n_blocks_per_superblock * uVar5;
    uVar8 = uVar16 / this->block_size;
    uVar15 = uVar8 - lVar7;
    if (uVar15 != 0) {
      uVar13 = 0x3f;
      if (uVar15 != 0) {
        for (; uVar15 >> uVar13 == 0; uVar13 = uVar13 - 1) {
        }
      }
      iVar4 = 1 << ((byte)uVar13 & 0x1f);
      lVar20 = (long)(iVar4 / 2) * uVar5;
      lVar23 = *(long *)((long)&(((this->block_mins).
                                  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)
                                ._M_impl.super__Vector_impl_data +
                        ((uVar13 & 0xffffffff) * 3 & 0xffffffff) * 8);
      uVar15 = puVar1[*(ushort *)(lVar23 + (lVar7 - lVar20) * 2) + uVar12];
      uVar13 = *_Var17._M_current;
      if (uVar15 < *_Var17._M_current) {
        _Var17._M_current = puVar1 + *(ushort *)(lVar23 + (lVar7 - lVar20) * 2) + uVar12;
        uVar13 = uVar15;
      }
      if (puVar1[*(ushort *)(lVar23 + (uVar8 - (iVar4 + lVar20)) * 2) + uVar12] < uVar13) {
        _Var17._M_current = puVar1 + *(ushort *)(lVar23 + (uVar8 - (iVar4 + lVar20)) * 2) + uVar12;
      }
    }
    uVar8 = uVar8 * this->block_size;
    if (uVar8 < uVar16) {
      puVar10 = puVar1 + uVar8;
      puVar9 = puVar1 + uVar8 + 1;
      if (puVar9 != range_end._M_current && puVar10 != range_end._M_current) {
        uVar12 = *puVar10;
        do {
          if (*puVar9 < uVar12) {
            puVar10 = puVar9;
            uVar12 = *puVar9;
          }
          puVar9 = puVar9 + 1;
        } while (puVar9 != range_end._M_current);
      }
      if (*puVar10 < *_Var17._M_current) {
        _Var17._M_current = puVar10;
      }
    }
  }
  if (uVar5 < uVar18) {
    uVar5 = this->block_size;
    uVar22 = uVar22 / uVar5 + 1;
    if (puVar1 == range_begin._M_current) {
      uVar22 = 0;
    }
    uVar12 = uVar16 / uVar5;
    uVar8 = uVar12 - uVar22;
    if (uVar12 < uVar22 || uVar8 == 0) {
      puVar10 = range_begin._M_current + 1;
      if (puVar10 != range_end._M_current && range_begin._M_current != range_end._M_current) {
        uVar16 = *range_begin._M_current;
        do {
          if (*puVar10 < uVar16) {
            range_begin._M_current = puVar10;
            uVar16 = *puVar10;
          }
          puVar10 = puVar10 + 1;
        } while (puVar10 != range_end._M_current);
      }
      if (*range_begin._M_current < *_Var17._M_current) {
        _Var17._M_current = range_begin._M_current;
      }
    }
    else {
      if (uVar22 / this->n_blocks_per_superblock != uVar12 / this->n_blocks_per_superblock) {
        __assert_fail("left_b / n_blocks_per_superblock == right_b / n_blocks_per_superblock",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                      ,0x114,
                      "Iterator rmq<__gnu_cxx::__normal_iterator<const unsigned long *, std::vector<unsigned long>>>::query(Iterator, Iterator) [Iterator = __gnu_cxx::__normal_iterator<const unsigned long *, std::vector<unsigned long>>, index_t = unsigned long]"
                     );
      }
      uVar15 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> uVar15 == 0; uVar15 = uVar15 - 1) {
        }
      }
      iVar4 = 1 << ((byte)uVar15 & 0x1f);
      if (uVar18 < 2) {
        lVar23 = 0;
        lVar7 = 0;
      }
      else {
        lVar7 = (long)(iVar4 / 2) * uVar6;
        lVar23 = uVar2 * uVar6;
      }
      lVar20 = *(long *)&(this->block_mins).
                         super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar15 & 0xffffffff].
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data;
      uVar2 = puVar1[(ulong)*(ushort *)(lVar20 + (uVar22 - lVar7) * 2) + lVar23];
      uVar18 = *_Var17._M_current;
      if (uVar2 < *_Var17._M_current) {
        _Var17._M_current = puVar1 + (ulong)*(ushort *)(lVar20 + (uVar22 - lVar7) * 2) + lVar23;
        uVar18 = uVar2;
      }
      if (puVar1[(ulong)*(ushort *)(lVar20 + (uVar12 - (iVar4 + lVar7)) * 2) + lVar23] < uVar18) {
        _Var17._M_current =
             puVar1 + (ulong)*(ushort *)(lVar20 + (uVar12 - (iVar4 + lVar7)) * 2) + lVar23;
      }
      if (uVar19 < uVar22 * uVar5) {
        puVar9 = puVar1 + uVar22 * uVar5;
        puVar10 = range_begin._M_current + 1;
        if (puVar10 != puVar9 && puVar9 != range_begin._M_current) {
          uVar19 = *range_begin._M_current;
          do {
            if (*puVar10 < uVar19) {
              range_begin._M_current = puVar10;
              uVar19 = *puVar10;
            }
            puVar10 = puVar10 + 1;
          } while (puVar10 != puVar9);
        }
        if (*range_begin._M_current < *_Var17._M_current) {
          _Var17._M_current = range_begin._M_current;
        }
      }
      uVar12 = uVar12 * uVar5;
      if (uVar12 < uVar16) {
        puVar10 = puVar1 + uVar12;
        puVar9 = puVar1 + uVar12 + 1;
        if (puVar9 != range_end._M_current && puVar10 != range_end._M_current) {
          uVar16 = *puVar10;
          do {
            if (*puVar9 < uVar16) {
              puVar10 = puVar9;
              uVar16 = *puVar9;
            }
            puVar9 = puVar9 + 1;
          } while (puVar9 != range_end._M_current);
        }
        if (*puVar10 < *_Var17._M_current) {
          _Var17._M_current = puVar10;
        }
      }
    }
  }
  return (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          )_Var17._M_current;
}

Assistant:

Iterator query(Iterator range_begin, Iterator range_end) {
        // find superblocks fully contained within range
        index_t begin_idx = std::distance(_begin, range_begin);
        index_t end_idx = std::distance(_begin, range_end);
        assert(begin_idx < end_idx);
        assert(end_idx <= n);

        // round up to next superblock
        index_t left_sb  = (begin_idx - 1) / superblock_size + 1;
        if (begin_idx == 0)
            left_sb = 0;
        // round down to prev superblock
        index_t right_sb = end_idx / superblock_size;

        // init result
        Iterator min_pos = range_begin;

        // if there is at least one superblock
        if (left_sb < right_sb) {
            // get largest power of two that doesn't exceed the number of
            // superblocks from (left,right)
            index_t n_sb = right_sb - left_sb;
            unsigned int dist = floorlog2(n_sb);

            assert(dist < superblock_mins.size() && left_sb < superblock_mins[dist].size());
            min_pos = _begin + superblock_mins[dist][left_sb];
            assert(dist < superblock_mins.size() && right_sb - (1<<dist) < superblock_mins[dist].size());
            Iterator right_sb_min = _begin + superblock_mins[dist][right_sb - (1 << dist)];
            if (*min_pos > *right_sb_min) {
                min_pos = right_sb_min;
            }
        }

        // go to left -> blocks -> sub-block
        if (left_sb <= right_sb && left_sb != 0 && begin_idx != left_sb*superblock_size) {
            index_t left_b = (begin_idx - 1) / block_size + 1;
            index_t left_b_gidx = left_b * block_size;
            left_b -= (left_sb - 1)*n_blocks_per_superblock;
            index_t n_b = n_blocks_per_superblock - left_b;
            if (n_b > 0) {
                unsigned int level = ceillog2(n_b);
                index_t sb_offset = (left_sb-1)*(n_blocks_per_superblock - (1<<level)/2);
                Iterator block_min_it = _begin + block_mins[level][left_b + sb_offset] + (left_sb-1)*superblock_size;
                if (*block_min_it < *min_pos)
                    min_pos = block_min_it;
            }

            // go left into remaining block, if elements left
            if (left_b_gidx > begin_idx) {
                // linearly search (at most block_size elements)
                Iterator inblock_min_it = std::min_element(range_begin, _begin + left_b_gidx);
                if (*inblock_min_it < *min_pos) {
                    min_pos = inblock_min_it;
                }
            }
        }

        // go to right -> blocks -> sub-block
        if (left_sb <= right_sb && right_sb != n_superblocks && end_idx != right_sb*superblock_size) {
            index_t left_b = right_sb*n_blocks_per_superblock;
            index_t right_b = end_idx / block_size;
            index_t n_b = right_b - left_b;
            if (n_b > 0) {
                unsigned int dist = floorlog2(n_b);
                index_t sb_offset = right_sb*((1<<dist)/2);
                Iterator block_min_it = _begin + block_mins[dist][left_b - sb_offset] + (right_sb)*superblock_size;
                if (*block_min_it < *min_pos)
                    min_pos = block_min_it;
                block_min_it = _begin + block_mins[dist][right_b - sb_offset - (1<<dist)] + (right_sb)*superblock_size;
                if (*block_min_it < *min_pos)
                    min_pos = block_min_it;
            }

            // go right into remaining block, if elements left
            index_t left_gl_idx = right_b*block_size;
            if (left_gl_idx < end_idx) {
                // linearly search (at most block_size elements)
                Iterator inblock_min_it = std::min_element(_begin + left_gl_idx, range_end);
                if (*inblock_min_it < *min_pos) {
                    min_pos = inblock_min_it;
                }
            }
        }

        // if there are no superblocks covered (both indeces in same superblock)
        if (left_sb > right_sb) {
            index_t left_b = (begin_idx - 1) / block_size + 1;
            if (begin_idx == 0)
                left_b = 0;
            index_t right_b = end_idx / block_size;


            if (left_b < right_b) {
                // if blocks are in between: get mins of blocks in range
                // NOTE: there was a while if-else block here to handle the
                //       case if blocks would span accross the boundary of two
                //       superblocks, this should however never happen
                //       git blame this line to find where this code was removed
                // assert blocks lie in the same superblock
                assert(left_b / n_blocks_per_superblock == right_b / n_blocks_per_superblock);

                unsigned int dist = floorlog2(right_b - left_b);
                index_t sb_offset = 0;
                index_t sb_size_offset = 0;
                if (left_sb > 1) {
                    sb_offset = (left_sb-1)*((1<<dist)/2);
                    sb_size_offset = (left_sb-1)*superblock_size;
                }
                Iterator block_min_it = _begin + block_mins[dist][left_b - sb_offset] + sb_size_offset;
                if (*block_min_it < *min_pos)
                    min_pos = block_min_it;
                block_min_it = _begin + block_mins[dist][right_b - sb_offset - (1<<dist)] + sb_size_offset;
                if (*block_min_it < *min_pos)
                    min_pos = block_min_it;

                // remaining inblock
                if (begin_idx < left_b*block_size) {
                    Iterator inblock_min_it = std::min_element(range_begin, _begin + left_b*block_size);
                    if (*inblock_min_it < *min_pos) {
                        min_pos = inblock_min_it;
                    }
                }
                if (end_idx > right_b*block_size) {
                    Iterator inblock_min_it = std::min_element(_begin + right_b*block_size, range_end);
                    if (*inblock_min_it < *min_pos) {
                        min_pos = inblock_min_it;
                    }
                }
            } else {
                // no blocks at all
                Iterator inblock_min_it = std::min_element(range_begin, range_end);
                if (*inblock_min_it < *min_pos) {
                    min_pos = inblock_min_it;
                }
            }

        }

        // return the minimum found
        return min_pos;
    }